

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O0

uint32_t __thiscall Mapper004::calcRBankOffset(Mapper004 *this,uint8_t idx)

{
  int32_t offset;
  uint8_t idx_local;
  Mapper004 *this_local;
  
  return (uint)(byte)((ulong)idx %
                     (ulong)(long)(int)(((uint)this->params->sizePrgRom << 0xe) / 0x2000)) * 0x2000;
}

Assistant:

uint32_t Mapper004::calcRBankOffset(uint8_t idx) {
    if (idx > 0x80) {
        idx -= 0x100;
    }
    idx %= ((params->sizePrgRom * 16384) / 0x2000);
    int32_t offset = idx * 0x2000;
    if (offset < 0) {
        offset += (params->sizePrgRom * 16384);
    }
    return uint32_t(offset);
}